

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> * __thiscall
kj::ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective>::operator=
          (ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *this,
          ArrayBuilder<capnp::compiler::CompilerMain::OutputDirective> *other)

{
  RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (OutputDirective *)0x0;
  other->pos = (RemoveConst<capnp::compiler::CompilerMain::OutputDirective> *)0x0;
  other->endPtr = (OutputDirective *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }